

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

void __thiscall deci::ast_identifier_t::~ast_identifier_t(ast_identifier_t *this)

{
  std::__cxx11::string::~string((string *)&this->value);
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011d3d8;
  return;
}

Assistant:

ast_identifier_t::~ast_identifier_t() {
    ;
  }